

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CManageClient.cpp
# Opt level: O0

CClient * __thiscall CManageClient::FindClient(CManageClient *this,int flag)

{
  bool bVar1;
  size_type sVar2;
  const_reference ppCVar3;
  int local_20;
  int i;
  int flag_local;
  CManageClient *this_local;
  
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<CClient_*,_std::allocator<CClient_*>_>::size(&this->m_Clients);
    if (sVar2 <= (ulong)(long)local_20) {
      return (CClient *)0x0;
    }
    ppCVar3 = std::vector<CClient_*,_std::allocator<CClient_*>_>::operator[]
                        (&this->m_Clients,(long)local_20);
    bVar1 = CClient::IsMe(*ppCVar3,flag);
    if (bVar1) break;
    local_20 = local_20 + 1;
  }
  ppCVar3 = std::vector<CClient_*,_std::allocator<CClient_*>_>::operator[]
                      (&this->m_Clients,(long)local_20);
  return *ppCVar3;
}

Assistant:

CClient* CManageClient::FindClient(const int flag) const{
    for(int i = 0;i < m_Clients.size();i++){
        if(m_Clients[i]->IsMe(flag))
            return m_Clients[i];
    }
    return NULL;
}